

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool ReadLinsData(string *DataFile,VecVector3d *Accel,VecVector3d *Gyro)

{
  byte bVar1;
  ostream *this;
  char *pcVar2;
  istream *piVar3;
  Scalar *pSVar4;
  _Ios_Openmode in_EDI;
  double dVar5;
  Vector3d Gyro_temp;
  Vector3d Accel_temp;
  long SOW;
  long week;
  stringstream buff;
  string line;
  ifstream in;
  value_type *in_stack_fffffffffffffac8;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_fffffffffffffad0;
  long local_3f0;
  long local_3e8;
  stringstream local_3e0 [16];
  ostream local_3d0 [376];
  string local_258 [32];
  undefined4 local_238;
  long local_228 [68];
  byte local_1;
  
  std::ifstream::ifstream((string *)local_228);
  std::ifstream::open((string *)local_228,in_EDI);
  bVar1 = std::ios::operator!((ios *)((long)local_228 + *(long *)(local_228[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
      std::__cxx11::string::string(local_258);
      std::__cxx11::stringstream::stringstream(local_3e0);
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_228,local_258)
      ;
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_258);
      if (*pcVar2 == 'm') {
        local_238 = 2;
      }
      else {
        Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x1a77ab);
        Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x1a77ba);
        std::operator<<(local_3d0,local_258);
        piVar3 = (istream *)std::istream::operator>>((istream *)local_3e0,&local_3e8);
        piVar3 = (istream *)std::istream::operator>>(piVar3,&local_3f0);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        piVar3 = (istream *)std::istream::operator>>(piVar3,pSVar4);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        piVar3 = (istream *)std::istream::operator>>(piVar3,pSVar4);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        piVar3 = (istream *)std::istream::operator>>(piVar3,pSVar4);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        piVar3 = (istream *)std::istream::operator>>(piVar3,pSVar4);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        piVar3 = (istream *)std::istream::operator>>(piVar3,pSVar4);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        std::istream::operator>>(piVar3,pSVar4);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        dVar5 = *pSVar4;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        *pSVar4 = dVar5 * 9.7936174;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        dVar5 = *pSVar4;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        *pSVar4 = dVar5 * 9.7936174;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        dVar5 = *pSVar4;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        *pSVar4 = dVar5 * -9.7936174;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        dVar5 = Deg2Rad(*pSVar4);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        *pSVar4 = dVar5 / 3600.0;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        dVar5 = Deg2Rad(*pSVar4);
        in_stack_fffffffffffffad0 =
             (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(dVar5 / 3600.0);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        *pSVar4 = (Scalar)in_stack_fffffffffffffad0;
        in_stack_fffffffffffffac8 =
             (value_type *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        dVar5 = Deg2Rad(-(in_stack_fffffffffffffac8->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                         m_data.array[0]);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8);
        *pSVar4 = dVar5 / 3600.0;
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
        local_238 = 0;
      }
      std::__cxx11::stringstream::~stringstream(local_3e0);
      std::__cxx11::string::~string(local_258);
    }
    local_1 = 1;
  }
  else {
    this = std::operator<<((ostream *)&std::cout,"open file error");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
  }
  local_238 = 1;
  std::ifstream::~ifstream(local_228);
  return (bool)(local_1 & 1);
}

Assistant:

bool ReadLinsData(const string DataFile, VecVector3d &Accel, VecVector3d &Gyro)
{
    ifstream in;
    in.open(DataFile);
    if(!in)
    {
        cout << "open file error" << endl;
        return false;
    }

    while(!in.eof())
    {
        string line;
        stringstream buff;
        getline(in, line);
        if(line[0] == 'm')
            continue;
        long int week, SOW;
        Vector3d Accel_temp, Gyro_temp;

        buff << line;
        buff >> week >> SOW >> Gyro_temp[1] >> Gyro_temp[0] >> Gyro_temp[2]
             >> Accel_temp[1] >> Accel_temp[0] >> Accel_temp[2];

        Accel_temp[0] = (Accel_temp[0] * GRAVITY);
        Accel_temp[1] = (Accel_temp[1] * GRAVITY);
        Accel_temp[2] = -(Accel_temp[2] * GRAVITY);
        
        Gyro_temp[0] = Deg2Rad((Gyro_temp[0])) / 3600.0;
        Gyro_temp[1] = Deg2Rad((Gyro_temp[1])) / 3600.0;
        Gyro_temp[2] = Deg2Rad(-(Gyro_temp[2])) / 3600.0;

        Accel.push_back(Accel_temp);
        Gyro.push_back(Gyro_temp);
    }

    return true;
}